

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

void lock_now(quicly_conn_t *conn,int is_reentrant)

{
  st_quicly_now_t *psVar1;
  uint8_t uVar2;
  int64_t iVar3;
  
  if ((conn->stash).now == 0) {
    if ((conn->stash).lock_count != '\0') {
      __assert_fail("conn->stash.lock_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x1e1,"void lock_now(quicly_conn_t *, int)");
    }
    psVar1 = ((conn->super).ctx)->now;
    iVar3 = (*psVar1->cb)(psVar1);
    (conn->stash).now = iVar3;
    uVar2 = (conn->stash).lock_count;
  }
  else {
    if (is_reentrant == 0) {
      __assert_fail("is_reentrant && \"caller must be reentrant\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x1e4,"void lock_now(quicly_conn_t *, int)");
    }
    uVar2 = (conn->stash).lock_count;
    if (uVar2 == '\0') {
      __assert_fail("conn->stash.lock_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x1e5,"void lock_now(quicly_conn_t *, int)");
    }
  }
  (conn->stash).lock_count = uVar2 + '\x01';
  return;
}

Assistant:

static void lock_now(quicly_conn_t *conn, int is_reentrant)
{
    if (conn->stash.now == 0) {
        assert(conn->stash.lock_count == 0);
        conn->stash.now = conn->super.ctx->now->cb(conn->super.ctx->now);
    } else {
        assert(is_reentrant && "caller must be reentrant");
        assert(conn->stash.lock_count != 0);
    }

    ++conn->stash.lock_count;
}